

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

UniValue *
blockheaderToJSON(UniValue *__return_storage_ptr__,CBlockIndex *tip,CBlockIndex *blockindex)

{
  string str;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  string key_10;
  string key_11;
  string key_12;
  string key_13;
  CBlockIndex *this;
  long in_FS_OFFSET;
  undefined1 auStack_7a8 [12];
  int confirmations;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_798;
  UniValue in_stack_fffffffffffff878;
  UniValue local_720;
  string local_6c8 [32];
  UniValue local_6a8;
  string local_650 [32];
  UniValue local_630;
  string local_5d8 [32];
  UniValue local_5b8;
  string local_560 [32];
  UniValue local_540;
  string local_4e8 [32];
  UniValue local_4c8;
  string local_470 [32];
  UniValue local_450;
  string local_3f8 [32];
  UniValue local_3d8;
  string local_380 [32];
  UniValue local_360;
  string local_308 [32];
  UniValue local_2e8;
  string local_290 [32];
  UniValue local_270;
  string local_218 [32];
  UniValue local_1f8;
  string local_1a0 [32];
  UniValue local_180;
  string local_128 [32];
  base_blob<256u> local_108 [32];
  string local_e8;
  UniValue local_c8;
  string local_70 [32];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  str._M_string_length._4_4_ = confirmations;
  str._0_12_ = auStack_7a8;
  str.field_2 = local_798;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"hash",(allocator<char> *)&confirmations);
  CBlockIndex::GetBlockHash((uint256 *)local_108,blockindex);
  base_blob<256u>::GetHex_abi_cxx11_(&local_e8,local_108);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_c8,&local_e8);
  key._M_string_length._4_4_ = confirmations;
  key._0_12_ = auStack_7a8;
  key.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string(local_70);
  this = CBlockIndex::GetAncestor(tip,blockindex->nHeight + 1);
  if ((this == (CBlockIndex *)0x0) || (this->pprev != blockindex)) {
    confirmations = (uint)(blockindex == tip) * 2 + -1;
    this = (CBlockIndex *)0x0;
  }
  else {
    confirmations = (tip->nHeight - blockindex->nHeight) + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"confirmations",(allocator<char> *)&local_e8);
  UniValue::UniValue<int_&,_int,_true>(&local_180,&confirmations);
  key_00._M_string_length._4_4_ = confirmations;
  key_00._0_12_ = auStack_7a8;
  key_00.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_00,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_180);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"height",(allocator<char> *)&local_e8);
  UniValue::UniValue<const_int_&,_int,_true>(&local_1f8,&blockindex->nHeight);
  key_01._M_string_length._4_4_ = confirmations;
  key_01._0_12_ = auStack_7a8;
  key_01.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_01,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_1f8);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"version",(allocator<char> *)&local_e8);
  UniValue::UniValue<const_int_&,_int,_true>(&local_270,&blockindex->nVersion);
  key_02._M_string_length._4_4_ = confirmations;
  key_02._0_12_ = auStack_7a8;
  key_02.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_02,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_270);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::string<std::allocator<char>>
            (local_290,"versionHex",(allocator<char> *)local_108);
  tinyformat::format<int>(&local_e8,"%08x",&blockindex->nVersion);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_2e8,&local_e8);
  key_03._M_string_length._4_4_ = confirmations;
  key_03._0_12_ = auStack_7a8;
  key_03.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_03,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_2e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"merkleroot",(allocator<char> *)local_108);
  base_blob<256u>::GetHex_abi_cxx11_(&local_e8,(base_blob<256u> *)&blockindex->hashMerkleRoot);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,&local_e8);
  key_04._M_string_length._4_4_ = confirmations;
  key_04._0_12_ = auStack_7a8;
  key_04.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_04,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_360);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"time",(allocator<char> *)&local_e8);
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_3d8,&blockindex->nTime);
  key_05._M_string_length._4_4_ = confirmations;
  key_05._0_12_ = auStack_7a8;
  key_05.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_05,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_3d8);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,"mediantime",(allocator<char> *)local_108);
  local_e8._M_dataplus._M_p = (pointer)CBlockIndex::GetMedianTimePast(blockindex);
  UniValue::UniValue<long,_long,_true>(&local_450,(long *)&local_e8);
  key_06._M_string_length._4_4_ = confirmations;
  key_06._0_12_ = auStack_7a8;
  key_06.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_06,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_450);
  std::__cxx11::string::~string(local_3f8);
  std::__cxx11::string::string<std::allocator<char>>(local_470,"nonce",(allocator<char> *)&local_e8)
  ;
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_4c8,&blockindex->nNonce);
  key_07._M_string_length._4_4_ = confirmations;
  key_07._0_12_ = auStack_7a8;
  key_07.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_07,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_4c8);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::string::string<std::allocator<char>>(local_4e8,"bits",(allocator<char> *)local_108);
  tinyformat::format<unsigned_int>(&local_e8,"%08x",&blockindex->nBits);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_540,&local_e8);
  key_08._M_string_length._4_4_ = confirmations;
  key_08._0_12_ = auStack_7a8;
  key_08.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_08,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_540);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_560,"difficulty",(allocator<char> *)local_108);
  local_e8._M_dataplus._M_p = (pointer)GetDifficulty(blockindex);
  UniValue::UniValue<double,_double,_true>(&local_5b8,(double *)&local_e8);
  key_09._M_string_length._4_4_ = confirmations;
  key_09._0_12_ = auStack_7a8;
  key_09.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_09,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_5b8);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d8,"chainwork",(allocator<char> *)local_108);
  base_uint<256u>::GetHex_abi_cxx11_(&local_e8,&blockindex->nChainWork);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_630,&local_e8);
  key_10._M_string_length._4_4_ = confirmations;
  key_10._0_12_ = auStack_7a8;
  key_10.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_10,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_630);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::string<std::allocator<char>>(local_650,"nTx",(allocator<char> *)&local_e8);
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_6a8,&blockindex->nTx);
  key_11._M_string_length._4_4_ = confirmations;
  key_11._0_12_ = auStack_7a8;
  key_11.field_2 = local_798;
  UniValue::pushKV(__return_storage_ptr__,key_11,in_stack_fffffffffffff878);
  UniValue::~UniValue(&local_6a8);
  std::__cxx11::string::~string(local_650);
  if (blockindex->pprev != (CBlockIndex *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_6c8,"previousblockhash",(allocator<char> *)(auStack_7a8 + 0xb));
    CBlockIndex::GetBlockHash((uint256 *)local_108,blockindex->pprev);
    base_blob<256u>::GetHex_abi_cxx11_(&local_e8,local_108);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_720,&local_e8);
    key_12._M_string_length._4_4_ = confirmations;
    key_12._0_12_ = auStack_7a8;
    key_12.field_2 = local_798;
    UniValue::pushKV(__return_storage_ptr__,key_12,in_stack_fffffffffffff878);
    UniValue::~UniValue(&local_720);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string(local_6c8);
  }
  if (this != (CBlockIndex *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffff8c0,"nextblockhash",
               (allocator<char> *)(auStack_7a8 + 0xb));
    CBlockIndex::GetBlockHash((uint256 *)local_108,this);
    base_blob<256u>::GetHex_abi_cxx11_(&local_e8,local_108);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)&local_798,&local_e8);
    key_13._M_string_length._4_4_ = confirmations;
    key_13._0_12_ = auStack_7a8;
    key_13.field_2 = local_798;
    UniValue::pushKV(__return_storage_ptr__,key_13,in_stack_fffffffffffff878);
    UniValue::~UniValue((UniValue *)&local_798);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff8c0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue blockheaderToJSON(const CBlockIndex& tip, const CBlockIndex& blockindex)
{
    // Serialize passed information without accessing chain state of the active chain!
    AssertLockNotHeld(cs_main); // For performance reasons

    UniValue result(UniValue::VOBJ);
    result.pushKV("hash", blockindex.GetBlockHash().GetHex());
    const CBlockIndex* pnext;
    int confirmations = ComputeNextBlockAndDepth(tip, blockindex, pnext);
    result.pushKV("confirmations", confirmations);
    result.pushKV("height", blockindex.nHeight);
    result.pushKV("version", blockindex.nVersion);
    result.pushKV("versionHex", strprintf("%08x", blockindex.nVersion));
    result.pushKV("merkleroot", blockindex.hashMerkleRoot.GetHex());
    result.pushKV("time", blockindex.nTime);
    result.pushKV("mediantime", blockindex.GetMedianTimePast());
    result.pushKV("nonce", blockindex.nNonce);
    result.pushKV("bits", strprintf("%08x", blockindex.nBits));
    result.pushKV("difficulty", GetDifficulty(blockindex));
    result.pushKV("chainwork", blockindex.nChainWork.GetHex());
    result.pushKV("nTx", blockindex.nTx);

    if (blockindex.pprev)
        result.pushKV("previousblockhash", blockindex.pprev->GetBlockHash().GetHex());
    if (pnext)
        result.pushKV("nextblockhash", pnext->GetBlockHash().GetHex());
    return result;
}